

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_result_modifier.cpp
# Opt level: O0

bool duckdb::BoundOrderModifier::Simplify
               (vector<duckdb::BoundOrderByNode,_true> *orders,
               vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
               *groups)

{
  bool bVar1;
  byte bVar2;
  undefined8 in_RSI;
  undefined8 in_RDI;
  pair<std::__detail::_Node_iterator<std::reference_wrapper<duckdb::Expression>,_true,_true>,_bool>
  pVar3;
  BoundOrderByNode *order_node;
  iterator __end1_1;
  iterator __begin1_1;
  vector<duckdb::BoundOrderByNode,_true> *__range1_1;
  vector<duckdb::BoundOrderByNode,_true> new_order_nodes;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *target;
  const_iterator __end1;
  const_iterator __begin1;
  vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
  *__range1;
  expression_set_t seen_expressions;
  undefined7 in_stack_fffffffffffffea8;
  undefined1 in_stack_fffffffffffffeaf;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
  *in_stack_fffffffffffffeb0;
  undefined7 in_stack_fffffffffffffeb8;
  undefined1 in_stack_fffffffffffffebf;
  _Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true> in_stack_fffffffffffffec0;
  vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> local_e8;
  _Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true> local_d0;
  reference local_c8;
  BoundOrderByNode *local_c0;
  __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
  local_b8;
  undefined8 local_b0;
  _Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true> local_90;
  undefined1 local_88;
  reference local_68;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *local_60;
  __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
  local_58;
  undefined8 local_50;
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  ::std::
  unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ::unordered_set((unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                   *)0xe6b7e4);
  local_50 = local_10;
  local_58._M_current =
       (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
       ::std::
       vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
       ::begin((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  local_60 = (unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
             ::std::
             vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
             ::end((vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>
                    *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
                             *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)), bVar1
        ) {
    local_68 = __gnu_cxx::
               __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
               ::operator*(&local_58);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffeb0);
    ::std::reference_wrapper<duckdb::Expression>::
    reference_wrapper<duckdb::Expression&,void,duckdb::Expression*>
              ((reference_wrapper<duckdb::Expression> *)in_stack_fffffffffffffeb0,
               (Expression *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    pVar3 = ::std::
            unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
            ::insert((unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                      *)in_stack_fffffffffffffec0._M_cur,
                     (value_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
    local_90._M_cur =
         (__node_type *)
         pVar3.first.super__Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true>.
         _M_cur;
    local_88 = pVar3.second;
    __gnu_cxx::
    __normal_iterator<const_duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_*,_std::vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>_>_>_>
    ::operator++(&local_58);
  }
  vector<duckdb::BoundOrderByNode,_true>::vector((vector<duckdb::BoundOrderByNode,_true> *)0xe6b8e9)
  ;
  local_b0 = local_8;
  local_b8._M_current =
       (BoundOrderByNode *)
       ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::begin
                 ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                  CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  local_c0 = (BoundOrderByNode *)
             ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::end
                       ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                         *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                             *)in_stack_fffffffffffffeb0,
                            (__normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
                             *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8)), bVar1
        ) {
    local_c8 = __gnu_cxx::
               __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
               ::operator*(&local_b8);
    unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
              ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
               in_stack_fffffffffffffeb0);
    ::std::reference_wrapper<duckdb::Expression>::
    reference_wrapper<duckdb::Expression&,void,duckdb::Expression*>
              ((reference_wrapper<duckdb::Expression> *)in_stack_fffffffffffffeb0,
               (Expression *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    local_d0._M_cur =
         (__node_type *)
         ::std::
         unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
         ::find((unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                 *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8),
                (key_type *)0xe6b997);
    local_e8.super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         (pointer)::std::
                  unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                  ::end((unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                         *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    bVar1 = ::std::__detail::operator!=
                      (&local_d0,
                       (_Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true> *)
                       &local_e8.
                        super__Vector_base<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>
                        ._M_impl.super__Vector_impl_data._M_finish);
    if (!bVar1) {
      unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::operator*
                ((unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *)
                 in_stack_fffffffffffffeb0);
      in_stack_fffffffffffffeb0 = &local_e8;
      ::std::reference_wrapper<duckdb::Expression>::
      reference_wrapper<duckdb::Expression&,void,duckdb::Expression*>
                ((reference_wrapper<duckdb::Expression> *)in_stack_fffffffffffffeb0,
                 (Expression *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      pVar3 = ::std::
              unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
              ::insert((unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                        *)in_stack_fffffffffffffec0._M_cur,
                       (value_type *)CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
      in_stack_fffffffffffffec0._M_cur =
           (__node_type *)
           pVar3.first.super__Node_iterator_base<std::reference_wrapper<duckdb::Expression>,_true>.
           _M_cur;
      in_stack_fffffffffffffebf = pVar3.second;
      ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::push_back
                (in_stack_fffffffffffffeb0,
                 (value_type *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
    }
    __gnu_cxx::
    __normal_iterator<duckdb::BoundOrderByNode_*,_std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>_>
    ::operator++(&local_b8);
  }
  ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::swap
            ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
             in_stack_fffffffffffffec0._M_cur,
             (vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
             CONCAT17(in_stack_fffffffffffffebf,in_stack_fffffffffffffeb8));
  bVar2 = ::std::vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_>::empty
                    ((vector<duckdb::BoundOrderByNode,_std::allocator<duckdb::BoundOrderByNode>_> *)
                     in_stack_fffffffffffffec0._M_cur);
  vector<duckdb::BoundOrderByNode,_true>::~vector
            ((vector<duckdb::BoundOrderByNode,_true> *)0xe6bab9);
  ::std::
  unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
  ::~unordered_set((unordered_set<std::reference_wrapper<duckdb::Expression>,_duckdb::ExpressionHashFunction<duckdb::Expression>,_duckdb::ExpressionEquality<duckdb::Expression>,_std::allocator<std::reference_wrapper<duckdb::Expression>_>_>
                    *)0xe6bac6);
  return (bool)(bVar2 & 1);
}

Assistant:

bool BoundOrderModifier::Simplify(vector<BoundOrderByNode> &orders, const vector<unique_ptr<Expression>> &groups) {
	// for each ORDER BY - check if it is actually necessary
	// expressions that are in the groups do not need to be ORDERED BY
	// `ORDER BY` on a group has no effect, because for each aggregate, the group is unique
	// similarly, we only need to ORDER BY each aggregate once
	expression_set_t seen_expressions;
	for (auto &target : groups) {
		seen_expressions.insert(*target);
	}
	vector<BoundOrderByNode> new_order_nodes;
	for (auto &order_node : orders) {
		if (seen_expressions.find(*order_node.expression) != seen_expressions.end()) {
			// we do not need to order by this node
			continue;
		}
		seen_expressions.insert(*order_node.expression);
		new_order_nodes.push_back(std::move(order_node));
	}
	orders.swap(new_order_nodes);

	return orders.empty(); // NOLINT
}